

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  bool bVar1;
  size_t extraout_RDX;
  FilePath FVar2;
  undefined1 local_40 [8];
  String dot_extension;
  
  String::Format((String *)local_40,".%s");
  bVar1 = String::EndsWithCaseInsensitive((String *)extension,(char *)local_40);
  if (bVar1) {
    String::ConstructNonNull
              ((String *)&dot_extension.length_,*(char **)extension,*(long *)(extension + 8) - 4);
    FilePath(this,(String *)&dot_extension.length_);
    String::~String((String *)&dot_extension.length_);
  }
  else {
    String::String(&this->pathname_,(String *)extension);
  }
  String::~String((String *)local_40);
  FVar2.pathname_.length_ = extraout_RDX;
  FVar2.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  String dot_extension(String::Format(".%s", extension));
  if (pathname_.EndsWithCaseInsensitive(dot_extension.c_str())) {
    return FilePath(String(pathname_.c_str(), pathname_.length() - 4));
  }
  return *this;
}